

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assign2productShort<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *A,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x)

{
  uint uVar1;
  pointer pnVar2;
  Item *pIVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  Real RVar5;
  bool bVar6;
  type_conflict5 tVar7;
  type_conflict5 tVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  cpp_dec_float<200u,int,void> *this_00;
  int iVar18;
  pointer pnVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar20;
  uint *puVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  uint *puVar23;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar24;
  cpp_dec_float<200U,_int,_void> *pcVar25;
  cpp_dec_float<200u,int,void> *pcVar26;
  int j;
  ulong uVar27;
  byte bVar28;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  product;
  cpp_dec_float<200U,_int,_void> local_338;
  cpp_dec_float<200U,_int,_void> local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x0;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t local_34;
  
  bVar28 = 0;
  lVar9 = (long)(x->super_IdxSet).num;
  if (lVar9 == 0) {
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)this);
  }
  else {
    iVar18 = *(x->super_IdxSet).idx;
    pnVar2 = (x->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar13 = 0x1c;
    puVar21 = (uint *)(pnVar2 + iVar18);
    puVar23 = (uint *)&x0;
    for (lVar12 = lVar13; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar23 = *puVar21;
      puVar21 = puVar21 + 1;
      puVar23 = puVar23 + 1;
    }
    x0.m_backend.exp = pnVar2[iVar18].m_backend.exp;
    x0.m_backend.neg = pnVar2[iVar18].m_backend.neg;
    x0.m_backend.fpclass = pnVar2[iVar18].m_backend.fpclass;
    x0.m_backend.prec_elem = pnVar2[iVar18].m_backend.prec_elem;
    pIVar3 = (A->set).theitem;
    iVar18 = (A->set).thekey[iVar18].idx;
    *(int *)(this + 8) =
         pIVar3[iVar18].data.
         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         .memused;
    puVar21 = (uint *)&x0;
    puVar23 = local_b0;
    for (; lVar13 != 0; lVar13 = lVar13 + -1) {
      *puVar23 = *puVar21;
      puVar21 = puVar21 + 1;
      puVar23 = puVar23 + 1;
    }
    local_40 = x0.m_backend.exp;
    local_3c = x0.m_backend.neg;
    local_38 = x0.m_backend.fpclass;
    local_34 = x0.m_backend.prec_elem;
    RVar5 = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
    bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_b0,RVar5);
    iVar11 = *(int *)(this + 8);
    if (iVar11 == 0 || bVar6) {
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)this);
      uVar17 = 0;
    }
    else {
      lVar12 = 0;
      uVar17 = 0;
      for (lVar13 = 0; lVar13 < iVar11; lVar13 = lVar13 + 1) {
        pNVar4 = pIVar3[iVar18].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        product.m_backend.fpclass = cpp_dec_float_finite;
        product.m_backend.prec_elem = 0x1c;
        product.m_backend.data._M_elems[0] = 0;
        product.m_backend.data._M_elems[1] = 0;
        product.m_backend.data._M_elems[2] = 0;
        product.m_backend.data._M_elems[3] = 0;
        product.m_backend.data._M_elems[4] = 0;
        product.m_backend.data._M_elems[5] = 0;
        product.m_backend.data._M_elems[6] = 0;
        product.m_backend.data._M_elems[7] = 0;
        product.m_backend.data._M_elems[8] = 0;
        product.m_backend.data._M_elems[9] = 0;
        product.m_backend.data._M_elems[10] = 0;
        product.m_backend.data._M_elems[0xb] = 0;
        product.m_backend.data._M_elems[0xc] = 0;
        product.m_backend.data._M_elems[0xd] = 0;
        product.m_backend.data._M_elems[0xe] = 0;
        product.m_backend.data._M_elems[0xf] = 0;
        product.m_backend.data._M_elems[0x10] = 0;
        product.m_backend.data._M_elems[0x11] = 0;
        product.m_backend.data._M_elems[0x12] = 0;
        product.m_backend.data._M_elems[0x13] = 0;
        product.m_backend.data._M_elems[0x14] = 0;
        product.m_backend.data._M_elems[0x15] = 0;
        product.m_backend.data._M_elems[0x16] = 0;
        product.m_backend.data._M_elems[0x17] = 0;
        product.m_backend.data._M_elems[0x18] = 0;
        product.m_backend.data._M_elems[0x19] = 0;
        product.m_backend.data._M_elems._104_5_ = 0;
        product.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        product.m_backend.exp = 0;
        product.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&product.m_backend,&x0.m_backend,
                   (cpp_dec_float<200U,_int,_void> *)((long)&(pNVar4->val).m_backend.data + lVar12))
        ;
        iVar11 = *(int *)((long)(&pNVar4->val + 1) + lVar12);
        *(int *)(*(long *)(this + 0x10) + uVar17 * 4) = iVar11;
        lVar15 = *(long *)(this + 0x20);
        lVar16 = (long)iVar11 * 0x80;
        pcVar22 = &product.m_backend;
        puVar21 = (uint *)(lVar15 + lVar16);
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          *puVar21 = (pcVar22->data)._M_elems[0];
          pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar28 * -8 + 4);
          puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
        }
        *(int *)(lVar15 + 0x70 + lVar16) = product.m_backend.exp;
        *(bool *)(lVar15 + 0x74 + lVar16) = product.m_backend.neg;
        *(undefined8 *)(lVar15 + 0x78 + lVar16) = product.m_backend._120_8_;
        local_2b0.data._M_elems[0] = 0;
        tVar7 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&product.m_backend,(int *)&local_2b0);
        uVar17 = (ulong)((int)uVar17 + (uint)tVar7);
        iVar11 = *(int *)(this + 8);
        lVar12 = lVar12 + 0x84;
      }
    }
    lVar12 = 0x1c;
    for (lVar13 = 1; lVar13 < lVar9; lVar13 = lVar13 + 1) {
      iVar18 = (x->super_IdxSet).idx[lVar13];
      pnVar2 = (x->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar19 = pnVar2 + iVar18;
      pnVar20 = &product;
      for (lVar15 = lVar12; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar20->m_backend).data._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
        pnVar19 = (pointer)((long)pnVar19 + ((ulong)bVar28 * -2 + 1) * 4);
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar28 * -2 + 1) * 4);
      }
      product.m_backend.exp = pnVar2[iVar18].m_backend.exp;
      product.m_backend.neg = pnVar2[iVar18].m_backend.neg;
      product.m_backend.fpclass = pnVar2[iVar18].m_backend.fpclass;
      product.m_backend.prec_elem = pnVar2[iVar18].m_backend.prec_elem;
      pIVar3 = (A->set).theitem;
      iVar18 = (A->set).thekey[iVar18].idx;
      uVar1 = pIVar3[iVar18].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused;
      pnVar20 = &product;
      pnVar24 = &local_230;
      for (lVar15 = lVar12; lVar15 != 0; lVar15 = lVar15 + -1) {
        (pnVar24->m_backend).data._M_elems[0] = (pnVar20->m_backend).data._M_elems[0];
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar28 * -2 + 1) * 4);
        pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar24 + ((ulong)bVar28 * -2 + 1) * 4);
      }
      local_230.m_backend.exp = product.m_backend.exp;
      local_230.m_backend.neg = product.m_backend.neg;
      local_230.m_backend.fpclass = product.m_backend.fpclass;
      local_230.m_backend.prec_elem = product.m_backend.prec_elem;
      RVar5 = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
      bVar6 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_230,RVar5);
      if ((uVar1 == 0) || (bVar6)) {
        if ((int)uVar1 < 1) {
          uVar1 = 0;
        }
        for (lVar15 = 0; (ulong)uVar1 * 0x84 != lVar15; lVar15 = lVar15 + 0x84) {
          pNVar4 = pIVar3[iVar18].data.
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          iVar11 = *(int *)((long)(&pNVar4->val + 1) + lVar15);
          *(int *)(*(long *)(this + 0x10) + (long)(int)uVar17 * 4) = iVar11;
          lVar14 = *(long *)(this + 0x20);
          lVar10 = (long)iVar11 * 0x80;
          pcVar22 = &local_2b0;
          puVar21 = (uint *)(lVar14 + lVar10);
          pcVar25 = pcVar22;
          for (lVar16 = lVar12; lVar16 != 0; lVar16 = lVar16 + -1) {
            (pcVar25->data)._M_elems[0] = *puVar21;
            puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
            pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + (ulong)bVar28 * -8 + 4);
          }
          local_2b0.exp = *(int *)(lVar14 + 0x70 + lVar10);
          local_2b0.neg = *(bool *)(lVar14 + 0x74 + lVar10);
          local_2b0._120_8_ = *(undefined8 *)(lVar14 + 0x78 + lVar10);
          local_338.data._M_elems._0_8_ = local_338.data._M_elems._0_8_ & 0xffffffff00000000;
          tVar7 = boost::multiprecision::operator==
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)pcVar22,(int *)&local_338);
          local_338.fpclass = cpp_dec_float_finite;
          local_338.prec_elem = 0x1c;
          local_338.data._M_elems[0] = 0;
          local_338.data._M_elems[1] = 0;
          local_338.data._M_elems[2] = 0;
          local_338.data._M_elems[3] = 0;
          local_338.data._M_elems[4] = 0;
          local_338.data._M_elems[5] = 0;
          local_338.data._M_elems[6] = 0;
          local_338.data._M_elems[7] = 0;
          local_338.data._M_elems[8] = 0;
          local_338.data._M_elems[9] = 0;
          local_338.data._M_elems[10] = 0;
          local_338.data._M_elems[0xb] = 0;
          local_338.data._M_elems[0xc] = 0;
          local_338.data._M_elems[0xd] = 0;
          local_338.data._M_elems[0xe] = 0;
          local_338.data._M_elems[0xf] = 0;
          local_338.data._M_elems[0x10] = 0;
          local_338.data._M_elems[0x11] = 0;
          local_338.data._M_elems[0x12] = 0;
          local_338.data._M_elems[0x13] = 0;
          local_338.data._M_elems[0x14] = 0;
          local_338.data._M_elems[0x15] = 0;
          local_338.data._M_elems[0x16] = 0;
          local_338.data._M_elems[0x17] = 0;
          local_338.data._M_elems[0x18] = 0;
          local_338.data._M_elems[0x19] = 0;
          local_338.data._M_elems._104_5_ = 0;
          local_338.data._M_elems[0x1b]._1_3_ = 0;
          local_338.exp = 0;
          local_338.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_338,&product.m_backend,
                     (cpp_dec_float<200U,_int,_void> *)
                     ((long)&(pNVar4->val).m_backend.data + lVar15));
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (pcVar22,&local_338);
          local_338.data._M_elems._0_8_ = local_338.data._M_elems._0_8_ & 0xffffffff00000000;
          tVar8 = boost::multiprecision::operator==
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)pcVar22,(int *)&local_338);
          this_00 = (cpp_dec_float<200u,int,void> *)
                    ((long)*(int *)((long)(&pNVar4->val + 1) + lVar15) * 0x80 +
                    *(long *)(this + 0x20));
          lVar14 = lVar12;
          pcVar26 = this_00;
          if (tVar8) {
            boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=(this_00,1e-100)
            ;
          }
          else {
            for (; lVar14 != 0; lVar14 = lVar14 + -1) {
              *(uint *)pcVar26 = (pcVar22->data)._M_elems[0];
              pcVar22 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar22 + (ulong)bVar28 * -8 + 4);
              pcVar26 = pcVar26 + (ulong)bVar28 * -8 + 4;
            }
            *(int *)(this_00 + 0x70) = local_2b0.exp;
            this_00[0x74] = (cpp_dec_float<200u,int,void>)local_2b0.neg;
            *(undefined8 *)(this_00 + 0x78) = local_2b0._120_8_;
          }
          uVar17 = (ulong)((int)uVar17 + (uint)tVar7);
        }
      }
    }
    uVar27 = 0;
    if ((int)uVar17 < 1) {
      uVar17 = uVar27;
    }
    iVar18 = 0;
    for (; uVar17 != uVar27; uVar27 = uVar27 + 1) {
      lVar9 = *(long *)(this + 0x20);
      iVar11 = *(int *)(*(long *)(this + 0x10) + uVar27 * 4);
      lVar12 = (long)iVar11 * 0x80;
      puVar21 = (uint *)(lVar9 + lVar12);
      pnVar20 = &local_1b0;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pnVar20->m_backend).data._M_elems[0] = *puVar21;
        puVar21 = puVar21 + (ulong)bVar28 * -2 + 1;
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar28 * -2 + 1) * 4);
      }
      local_1b0.m_backend.exp = *(int *)(lVar9 + 0x70 + lVar12);
      local_1b0.m_backend.neg = *(bool *)(lVar9 + 0x74 + lVar12);
      local_1b0.m_backend._120_8_ = *(undefined8 *)(lVar9 + 0x78 + lVar12);
      RVar5 = Tolerances::epsilon(*(Tolerances **)(this + 0x40));
      bVar6 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                        (&local_1b0,RVar5);
      if (bVar6) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)(lVar12 + *(long *)(this + 0x20)),0);
      }
      else {
        *(int *)(*(long *)(this + 0x10) + (long)iVar18 * 4) = iVar11;
        iVar18 = iVar18 + 1;
      }
      *(int *)(this + 8) = iVar18;
    }
  }
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assign2productShort(const SVSetBase<S>& A,
      const SSVectorBase<T>& x)
{
   assert(x.isSetup());

   if(x.size() == 0)   // x can be setup but have size 0 => this := zero vector
   {
      clear();
      return *this;
   }

   // compute x[0] * A[0]
   int curidx = x.idx[0];
   const T x0 = x.val[curidx];
   const SVectorBase<S>& A0 = A[curidx];
   int nonzero_idx = 0;
   int xsize = x.size();
   int Aisize;

   num = A0.size();

   if(isZero(x0, this->tolerances()->epsilon()) || num == 0)
   {
      // A[0] == 0 or x[0] == 0 => this := zero vector
      clear();
   }
   else
   {
      for(int j = 0; j < num; ++j)
      {
         const Nonzero<S>& elt = A0.element(j);
         const R product = x0 * elt.val;

         // store the value in any case
         idx[nonzero_idx] = elt.idx;
         VectorBase<R>::val[elt.idx] = product;

         // count only non-zero values; not 'isNotZero(product, epsilon)'
         if(product != 0)
            ++nonzero_idx;
      }
   }

   // Compute the other x[i] * A[i] and add them to the existing vector.
   for(int i = 1; i < xsize; ++i)
   {
      curidx = x.idx[i];
      const T xi     = x.val[curidx];
      const SVectorBase<S>& Ai = A[curidx];

      // If A[i] == 0 or x[i] == 0, do nothing.
      Aisize = Ai.size();

      if(isNotZero(xi, this->tolerances()->epsilon()) || Aisize == 0)
      {
         // Compute x[i] * A[i] and add it to the existing vector.
         for(int j = 0; j < Aisize; ++j)
         {
            const Nonzero<S>& elt = Ai.element(j);
            idx[nonzero_idx] = elt.idx;
            R oldval  = VectorBase<R>::val[elt.idx];

            // An old value of exactly 0 means the position is still unused.
            // It will be used now (either by a new nonzero or by a SOPLEX_VECTOR_MARKER),
            // so increase the counter. If oldval != 0, we just
            // change an existing NZ-element, so don't increase the counter.
            if(oldval == 0)
               ++nonzero_idx;

            // Add the current product x[i] * A[i][j]; if oldval was
            // SOPLEX_VECTOR_MARKER before, it does not hurt because SOPLEX_VECTOR_MARKER is really small.
            oldval += xi * elt.val;

            // If the new value is exactly 0, mark the index as used
            // by setting a value which is nearly 0; otherwise, store
            // the value. Values below epsilon will be removed later.
            if(oldval == 0)
               VectorBase<R>::val[elt.idx] = SOPLEX_VECTOR_MARKER;
            else
               VectorBase<R>::val[elt.idx] = oldval;
         }
      }
   }

   // Clean up by shifting all nonzeros (w.r.t. epsilon) to the front of idx,
   // zeroing all values which are nearly 0, and setting #num# appropriately.
   int nz_counter = 0;

   for(int i = 0; i < nonzero_idx; ++i)
   {
      curidx = idx[i];

      if(isZero(VectorBase<R>::val[curidx], this->tolerances()->epsilon()))
         VectorBase<R>::val[curidx] = 0;
      else
      {
         idx[nz_counter] = curidx;
         ++nz_counter;
      }

      num = nz_counter;
   }

   assert(isConsistent());

   return *this;
}